

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O1

void * allocmem(memory *m,int elemsize)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  
  if (m->current < m->last) {
    m->current = (void *)((long)m->current + (long)elemsize);
  }
  else {
    iVar1 = m->nr;
    m->nr = iVar1 + 1;
    if (0x62 < (long)iVar1) {
      return (void *)0x0;
    }
    iVar2 = m->allocnr;
    if (iVar2 <= iVar1) {
      pvVar3 = malloc((long)m->blocksize);
      m->block[(long)iVar1 + 1] = pvVar3;
      m->allocnr = iVar2 + 1;
    }
    pvVar3 = m->block[iVar1 + 1];
    m->first = pvVar3;
    m->current = pvVar3;
    m->last = (void *)((long)pvVar3 + ((long)m->blocksize - (long)elemsize));
  }
  return m->current;
}

Assistant:

void *allocmem(memory *m, int elemsize)
{
   if (m->current < m->last)
      m->current = (void *) ((char *) (m->current) + elemsize);
   else {
      if (++m->nr >= MAXBLOCKS) return NULL;
      if (m->nr > m->allocnr) {
         m->block[m->nr] = malloc(m->blocksize);
         m->allocnr++;
      }
      m->current = m->first = m->block[m->nr];
      m->last = (void *)
         ((char *) (m->first) + m->blocksize - elemsize);
   }
   return m->current;
}